

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O1

int mbedtls_md_hmac_finish(mbedtls_md_context_t *ctx,uchar *output)

{
  mbedtls_md_info_t *pmVar1;
  void *pvVar2;
  int iVar3;
  uchar tmp [64];
  uchar auStack_68 [72];
  
  iVar3 = -0x5100;
  if (ctx != (mbedtls_md_context_t *)0x0) {
    pmVar1 = ctx->md_info;
    iVar3 = -0x5100;
    if ((pmVar1 != (mbedtls_md_info_t *)0x0) && (pvVar2 = ctx->hmac_ctx, pvVar2 != (void *)0x0)) {
      iVar3 = pmVar1->block_size;
      (*pmVar1->finish_func)(ctx->md_ctx,auStack_68);
      (*ctx->md_info->starts_func)(ctx->md_ctx);
      (*ctx->md_info->update_func)
                (ctx->md_ctx,(uchar *)((long)pvVar2 + (long)iVar3),(long)ctx->md_info->block_size);
      (*ctx->md_info->update_func)(ctx->md_ctx,auStack_68,(long)ctx->md_info->size);
      (*ctx->md_info->finish_func)(ctx->md_ctx,output);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_md_hmac_finish( mbedtls_md_context_t *ctx, unsigned char *output )
{
    unsigned char tmp[MBEDTLS_MD_MAX_SIZE];
    unsigned char *opad;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    ctx->md_info->finish_func( ctx->md_ctx, tmp );
    ctx->md_info->starts_func( ctx->md_ctx );
    ctx->md_info->update_func( ctx->md_ctx, opad, ctx->md_info->block_size );
    ctx->md_info->update_func( ctx->md_ctx, tmp, ctx->md_info->size );
    ctx->md_info->finish_func( ctx->md_ctx, output );

    return( 0 );
}